

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

void lj_ir_kvalue(lua_State *L,TValue *tv,IRIns *ir)

{
  IRIns IVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  GCcdata *cd;
  IRIns *ir_local;
  TValue *tv_local;
  lua_State *L_local;
  GCcdata *cd_1;
  
  switch((ir->field_1).o) {
  case '\x16':
    tv->u64 = (ulong)((ir->field_1).t.irt & 0x1f) << 0x2f ^ 0xffffffffffffffff;
    break;
  case '\x17':
    tv->n = (double)ir->i;
    break;
  case '\x18':
    tv->u64 = (ulong)ir[1] | (ulong)((ir->field_1).t.irt & 0x1f ^ 0xffffffff) << 0x2f;
    break;
  case '\x19':
  case '\x1a':
    IVar1 = ir[1];
    auVar3._8_4_ = IVar1._4_4_;
    auVar3._0_8_ = IVar1;
    auVar3._12_4_ = 0x45300000;
    tv->n = (auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,IVar1.i) - 4503599627370496.0);
    break;
  case '\x1b':
    tv->u64 = 0;
    break;
  case '\x1c':
    *tv = *(TValue *)(ir + 1);
    break;
  case '\x1d':
    pvVar2 = lj_mem_newgco(L,0x18);
    *(undefined1 *)((long)pvVar2 + 9) = 10;
    *(undefined2 *)((long)pvVar2 + 10) = 0xb;
    *(IRIns *)((long)pvVar2 + 0x10) = ir[1];
    tv->u64 = (ulong)pvVar2 | 0xfffa800000000000;
  }
  return;
}

Assistant:

void lj_ir_kvalue(lua_State *L, TValue *tv, const IRIns *ir)
{
  UNUSED(L);
  lj_assertL(ir->o != IR_KSLOT, "unexpected KSLOT");  /* Common mistake. */
  switch (ir->o) {
  case IR_KPRI: setpriV(tv, irt_toitype(ir->t)); break;
  case IR_KINT: setintV(tv, ir->i); break;
  case IR_KGC: setgcV(L, tv, ir_kgc(ir), irt_toitype(ir->t)); break;
  case IR_KPTR: case IR_KKPTR:
    setnumV(tv, (lua_Number)(uintptr_t)ir_kptr(ir));
    break;
  case IR_KNULL: setintV(tv, 0); break;
  case IR_KNUM: setnumV(tv, ir_knum(ir)->n); break;
#if LJ_HASFFI
  case IR_KINT64: {
    GCcdata *cd = lj_cdata_new_(L, CTID_INT64, 8);
    *(uint64_t *)cdataptr(cd) = ir_kint64(ir)->u64;
    setcdataV(L, tv, cd);
    break;
    }
#endif
  default: lj_assertL(0, "bad IR constant op %d", ir->o); break;
  }
}